

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O2

IWorker * xmrig::Workers<xmrig::CpuLaunchData>::create(Thread<xmrig::CpuLaunchData> *handle)

{
  CpuLaunchData *data;
  uint32_t uVar1;
  CpuWorker<5UL> *this;
  
  uVar1 = (handle->m_config).intensity;
  if (uVar1 - 1 < 5) {
    data = &handle->m_config;
    switch(uVar1) {
    case 1:
      this = (CpuWorker<5UL> *)operator_new(0x3b0);
      CpuWorker<1UL>::CpuWorker((CpuWorker<1UL> *)this,handle->m_id,data);
      break;
    case 2:
      this = (CpuWorker<5UL> *)operator_new(0x4e0);
      CpuWorker<2UL>::CpuWorker((CpuWorker<2UL> *)this,handle->m_id,data);
      break;
    case 3:
      this = (CpuWorker<5UL> *)operator_new(0x600);
      CpuWorker<3UL>::CpuWorker((CpuWorker<3UL> *)this,handle->m_id,data);
      break;
    case 4:
      this = (CpuWorker<5UL> *)operator_new(0x730);
      CpuWorker<4UL>::CpuWorker((CpuWorker<4UL> *)this,handle->m_id,data);
      break;
    case 5:
      this = (CpuWorker<5UL> *)operator_new(0x850);
      CpuWorker<5UL>::CpuWorker(this,handle->m_id,data);
    }
  }
  else {
    this = (CpuWorker<5UL> *)0x0;
  }
  return (IWorker *)this;
}

Assistant:

xmrig::IWorker *xmrig::Workers<CpuLaunchData>::create(Thread<CpuLaunchData> *handle)
{
    switch (handle->config().intensity) {
    case 1:
        return new CpuWorker<1>(handle->id(), handle->config());

    case 2:
        return new CpuWorker<2>(handle->id(), handle->config());

    case 3:
        return new CpuWorker<3>(handle->id(), handle->config());

    case 4:
        return new CpuWorker<4>(handle->id(), handle->config());

    case 5:
        return new CpuWorker<5>(handle->id(), handle->config());
    }

    return nullptr;
}